

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

void open_file(char *file,char **search_dirs)

{
  char **ppcVar1;
  char local_1028 [8];
  char buf [4096];
  char **dir;
  FILE *fp;
  char **search_dirs_local;
  char *file_local;
  
  if (0x1f < file_stack_ptr) {
    fatal_input_error("Too many levels of nested #include\'s.\n");
  }
  dir = (char **)0x0;
  if ((*file == '/') || (ppcVar1 = search_dirs, search_dirs == (char **)0x0)) {
    dir = (char **)fopen(file,"r");
  }
  else {
    while (buf._4088_8_ = ppcVar1, *(long *)buf._4088_8_ != 0) {
      sprintf(local_1028,"%s/%s",*(undefined8 *)buf._4088_8_,file);
      dir = (char **)fopen(local_1028,"r");
      if ((FILE *)dir != (FILE *)0x0) break;
      ppcVar1 = (char **)(buf._4088_8_ + 8);
    }
  }
  if (dir == (char **)0x0) {
    fatal_input_error("%s: No such file or directory.\n",file);
  }
  open_stream(file,(FILE *)dir);
  return;
}

Assistant:

void
open_file (const char *file, const char *search_dirs[])
{
  FILE *fp;
  const char **dir;
  char buf[4096];
  
  /* See if we've opened too many files already. */
  if (file_stack_ptr >= MAX_INCLUDE_DEPTH)
    fatal_input_error ("Too many levels of nested #include's.\n");

  /* If the filename has a leading slash, don't check directories.
   * Otherwise, check all the directories in the search path.
   */
  fp = NULL;
  if (file[0] == '/' || !search_dirs)
    fp = fopen (file, "r");
  else for (dir = &search_dirs[0]; *dir != NULL; dir++)
    {
      sprintf (buf, "%s/%s", *dir, file);
      fp = fopen (buf, "r");
      if (fp != NULL)
	break;
    }
  if (fp == NULL)
    fatal_input_error ("%s: No such file or directory.\n", file);

  open_stream (file, fp);
}